

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

int __thiscall Expr::MinimalHeaderSize(Expr *this,Env *env)

{
  FieldType FVar1;
  CaseExpr *pCVar2;
  ExprList *pEVar3;
  ID *pIVar4;
  bool bVar5;
  IDType IVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  LetField *f;
  Field *pFVar10;
  pointer ppCVar11;
  pointer ppEVar12;
  RecordField *pRVar13;
  _func_int **pp_Var14;
  undefined4 extraout_var;
  Type *pTVar15;
  Exception *this_00;
  ExceptionIDNotField *this_01;
  uint uVar16;
  ulong uVar17;
  int i;
  ulong uVar18;
  long lVar19;
  int local_64;
  Expr *local_60;
  ulong local_58;
  string local_50;
  
LAB_0011aa99:
  switch(this->expr_type_) {
  case EXPR_ID:
    pIVar4 = this->id_;
    IVar6 = Env::GetIDType(env,pIVar4);
    if (FUNC_PARAM < IVar6) {
      return -1;
    }
    if ((0x18U >> (IVar6 & 0x1f) & 1) == 0) {
      if (IVar6 != MACRO) {
        if ((0x347U >> (IVar6 & 0x1f) & 1) != 0) {
          return 0;
        }
        return -1;
      }
      this = Env::GetMacro(env,pIVar4);
    }
    else {
      pFVar10 = Env::GetField(env,pIVar4);
      if (pFVar10 == (Field *)0x0) {
        this_01 = (ExceptionIDNotField *)__cxa_allocate_exception(0x28);
        ExceptionIDNotField::ExceptionIDNotField(this_01,pIVar4);
        __cxa_throw(this_01,&ExceptionIDNotField::typeinfo,Exception::~Exception);
      }
      FVar1 = pFVar10->tof_;
      if (FVar1 != LET_FIELD) {
        if (TEMP_VAR_FIELD < FVar1) {
          return -1;
        }
        if ((0x7a0U >> (FVar1 & 0x1f) & 1) != 0) {
          return 0;
        }
        if ((0x50U >> (FVar1 & 0x1f) & 1) == 0) {
          if (FVar1 != CASE_FIELD) {
            return -1;
          }
          iVar9 = (*(pFVar10->type_->super_DataDepElement)._vptr_DataDepElement[0x13])
                            (pFVar10->type_,env);
          if (-1 < iVar9) {
            return iVar9;
          }
          return -1;
        }
        uVar7 = *(uint *)((long)&pFVar10[1].super_Object.filename._M_string_length + 4);
        if ((int)uVar7 < 0) {
          return -1;
        }
        iVar9 = (*(pFVar10->super_DataDepElement)._vptr_DataDepElement[0xc])
                          (pFVar10,env,(ulong)uVar7);
        goto LAB_0011ad3d;
      }
      this = *(Expr **)&pFVar10[1].super_DataDepElement.dde_type_;
    }
    goto LAB_0011aa99;
  case EXPR_NUM:
    return 0;
  case EXPR_SUBSCRIPT:
    pTVar15 = DataType(this->operand_[0],env);
    iVar9 = (*(pTVar15->super_DataDepElement)._vptr_DataDepElement[0xe])(pTVar15);
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x98))
                      ((long *)CONCAT44(extraout_var,iVar9),env);
    if (iVar9 < 0) {
      return -1;
    }
    bVar5 = ConstFold(this->operand_[1],env,&local_64);
    if (bVar5) {
      return iVar9 * local_64;
    }
    return -1;
  case EXPR_MEMBER:
    goto switchD_0011aab1_caseD_5;
  case EXPR_CALLARGS:
    pEVar3 = this->args_;
    if (pEVar3 == (ExprList *)0x0) {
      return 0;
    }
    ppEVar12 = (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if ((pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppEVar12) {
      uVar7 = 0;
      uVar17 = 0;
      uVar18 = 1;
      do {
        uVar8 = MinimalHeaderSize(ppEVar12[uVar17],env);
        uVar16 = uVar8;
        if ((int)uVar8 < (int)uVar7) {
          uVar16 = uVar7;
        }
        uVar8 = uVar8 | uVar7;
        uVar7 = uVar16;
        if ((int)uVar8 < 0) {
          uVar7 = 0xffffffff;
        }
        ppEVar12 = (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        bVar5 = uVar18 < (ulong)((long)(this->args_->
                                       super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)ppEVar12 >> 3);
        uVar17 = uVar18;
        uVar18 = (ulong)((int)uVar18 + 1);
      } while (bVar5);
      return uVar7;
    }
    return 0;
  case EXPR_SIZEOF:
    pIVar4 = this->operand_[0]->id_;
    pRVar13 = anon_unknown.dwarf_9a855::GetRecordField(pIVar4,env);
    if (pRVar13 == (RecordField *)0x0) {
      pTVar15 = TypeDecl::LookUpType(pIVar4);
      if (pTVar15 == (Type *)0x0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x20);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"not a record field or type","");
        Exception::Exception(this_00,&pIVar4->super_Object,&local_50);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      return 0;
    }
    iVar9 = (*(pRVar13->super_Field).super_DataDepElement._vptr_DataDepElement[0xc])
                      (pRVar13,env,0xffffffff);
    if (-1 < iVar9) {
      return 0;
    }
    uVar7 = pRVar13->static_offset_;
    if ((int)uVar7 < 0) {
      return -1;
    }
    pp_Var14 = (pRVar13->super_Field).super_DataDepElement._vptr_DataDepElement;
    break;
  case EXPR_OFFSETOF:
    pRVar13 = anon_unknown.dwarf_9a855::GetRecordField(this->operand_[0]->id_,env);
    if (-1 < pRVar13->static_offset_) {
      return pRVar13->static_offset_;
    }
    pRVar13 = pRVar13->prev_;
    uVar7 = pRVar13->static_offset_;
    if ((int)uVar7 < 0) {
      return -1;
    }
    pp_Var14 = (pRVar13->super_Field).super_DataDepElement._vptr_DataDepElement;
    break;
  default:
    if (this->expr_type_ == EXPR_CASE) {
      uVar7 = MinimalHeaderSize(this->operand_[0],env);
      ppCVar11 = (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
      if ((this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppCVar11) {
        local_58 = 0;
        local_60 = this;
        do {
          pCVar2 = ppCVar11[local_58];
          pEVar3 = pCVar2->index_;
          if ((pEVar3 != (ExprList *)0x0) &&
             (ppEVar12 = (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                         super__Vector_impl_data._M_start,
             (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
             super__Vector_impl_data._M_finish != ppEVar12)) {
            uVar17 = 0;
            uVar18 = 1;
            do {
              uVar8 = MinimalHeaderSize(ppEVar12[uVar17],env);
              uVar16 = uVar8;
              if ((int)uVar8 < (int)uVar7) {
                uVar16 = uVar7;
              }
              uVar8 = uVar8 | uVar7;
              uVar7 = uVar16;
              if ((int)uVar8 < 0) {
                uVar7 = 0xffffffff;
              }
              ppEVar12 = (pCVar2->index_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>).
                         _M_impl.super__Vector_impl_data._M_start;
              bVar5 = uVar18 < (ulong)((long)(pCVar2->index_->
                                             super__Vector_base<Expr_*,_std::allocator<Expr_*>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppEVar12 >> 3);
              uVar17 = uVar18;
              uVar18 = (ulong)((int)uVar18 + 1);
            } while (bVar5);
          }
          uVar8 = MinimalHeaderSize(pCVar2->value_,env);
          uVar16 = uVar8;
          if ((int)uVar8 < (int)uVar7) {
            uVar16 = uVar7;
          }
          uVar8 = uVar8 | uVar7;
          uVar7 = uVar16;
          if ((int)uVar8 < 0) {
            uVar7 = 0xffffffff;
          }
          local_58 = (ulong)((int)local_58 + 1);
          ppCVar11 = (local_60->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (local_58 <
                 (ulong)((long)(local_60->cases_->
                               super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)ppCVar11 >> 3));
        return uVar7;
      }
      return uVar7;
    }
  case EXPR_CSTR:
  case EXPR_REGEX:
  case EXPR_PAREN:
  case EXPR_CALL:
    lVar19 = 0;
    uVar7 = 0;
    do {
      if (this->operand_[lVar19] != (Expr *)0x0) {
        uVar8 = MinimalHeaderSize(this->operand_[lVar19],env);
        uVar16 = uVar8;
        if ((int)uVar8 < (int)uVar7) {
          uVar16 = uVar7;
        }
        uVar8 = uVar8 | uVar7;
        uVar7 = uVar16;
        if ((int)uVar8 < 0) {
          uVar7 = 0xffffffff;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    return uVar7;
  }
  iVar9 = (*pp_Var14[0xc])(pRVar13,env,(ulong)uVar7);
LAB_0011ad3d:
  if (-1 < iVar9) {
    return uVar7 + iVar9;
  }
  return -1;
switchD_0011aab1_caseD_5:
  this = this->operand_[0];
  goto LAB_0011aa99;
}

Assistant:

int Expr::MinimalHeaderSize(Env* env)
	{
	int mhs;

	switch ( expr_type_ )
		{
		case EXPR_NUM:
			// Zero byte is required
			mhs = 0;
			break;

		case EXPR_ID:
			mhs = mhs_id(env, id_);
			break;

		case EXPR_MEMBER:
			// TODO: this is not a tight bound because
			// one actually does not have to parse the
			// whole record to compute one particular
			// field.
			mhs = operand_[0]->MinimalHeaderSize(env);
			break;

		case EXPR_SUBSCRIPT:
			{
			int index;
			Type* array_type = operand_[0]->DataType(env);
			Type* elem_type = array_type->ElementDataType();
			int elem_size = elem_type->StaticSize(env);
			if ( elem_size >= 0 && operand_[1]->ConstFold(env, &index) )
				{
				mhs = elem_size * index;
				}
			else
				{
				mhs = -1;
				}
			}
			break;

		case EXPR_SIZEOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* rf;
			Type* ty;

			if ( (rf = GetRecordField(id, env)) != nullptr )
				{
				if ( rf->StaticSize(env, -1) >= 0 )
					mhs = 0;
				else
					mhs = mhs_recordfield(env, rf);
				}

			else if ( (ty = TypeDecl::LookUpType(id)) != nullptr )
				{
				mhs = 0;
				}

			else
				throw Exception(id, "not a record field or type");
			}
			break;

		case EXPR_OFFSETOF:
			{
			const ID* id = operand_[0]->id();
			ASSERT(id);
			RecordField* field = GetRecordField(id, env);

			mhs = field->static_offset();
			if ( mhs < 0 )
				{
				mhs = 0;
				// Take the MHS of the preceding (non-let) field
				RecordField* prev_field = field->prev();
				ASSERT(prev_field);
				mhs = mhs_recordfield(env, prev_field);
				}
			}
			break;

		case EXPR_CALLARGS:
			{
			mhs = 0;
			if ( args_ )
				for ( unsigned int i = 0; i < args_->size(); ++i )
					mhs = mhs_max(mhs, (*args_)[i]->MinimalHeaderSize(env));
			}
			break;
		case EXPR_CASE:
			{
			mhs = operand_[0]->MinimalHeaderSize(env);
			for ( unsigned int i = 0; i < cases_->size(); ++i )
				{
				CaseExpr* ce = (*cases_)[i];
				if ( ce->index() )
					for ( unsigned int j = 0; j < ce->index()->size(); ++j )
						mhs = mhs_max(mhs, (*ce->index())[j]->MinimalHeaderSize(env));
				mhs = mhs_max(mhs, ce->value()->MinimalHeaderSize(env));
				}
			}
			break;
		default:
			// Evaluate every operand by default
			mhs = 0;
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					mhs = mhs_max(mhs, operand_[i]->MinimalHeaderSize(env));
			break;
		}

	return mhs;
	}